

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t is_symlink(char *file,wchar_t line,char *pathname,char *contents,wchar_t isdir)

{
  int iVar1;
  ssize_t sVar2;
  char *fmt;
  stat st;
  char buff [300];
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = lstat(pathname,(stat *)&st);
  if (iVar1 == 0) {
    if ((st.st_mode & 0xf000) != 0xa000) {
      return L'\0';
    }
    if (contents == (char *)0x0) {
      return L'\x01';
    }
    sVar2 = readlink(pathname,buff,299);
    if (-1 < sVar2) {
      buff[sVar2] = '\0';
      iVar1 = strcmp(buff,contents);
      return (uint)(iVar1 == 0);
    }
    fmt = "Can\'t read symlink %s";
  }
  else {
    fmt = "Symlink should exist: %s";
  }
  failure_start(file,line,fmt,pathname);
  failure_finish(file);
  return L'\0';
}

Assistant:

static int
is_symlink(const char *file, int line,
    const char *pathname, const char *contents, int isdir)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
	HANDLE h;
	DWORD inbytes;
	REPARSE_DATA_BUFFER *buf;
	BY_HANDLE_FILE_INFORMATION st;
	size_t len, len2;
	wchar_t *linknamew, *contentsw;
	const char *p;
	char *s, *pn;
	int ret = 0;
	BYTE *indata;
	const DWORD flag = FILE_FLAG_BACKUP_SEMANTICS |
	    FILE_FLAG_OPEN_REPARSE_POINT;

	/* Replace slashes with backslashes in pathname */
	pn = malloc(strlen(pathname) + 1);
	if (pn == NULL) {
		failure_start(file, line, "Can't allocate memory");
		failure_finish(NULL);
		return (0);
	}
	for (p = pathname, s = pn; *p != '\0'; p++, s++) {
		if (*p == '/')
			*s = '\\';
		else
			*s = *p;
	}
	*s = '\0';

	h = CreateFileA(pn, 0, FILE_SHARE_READ, NULL, OPEN_EXISTING,
	    flag, NULL);
	free(pn);
	if (h == INVALID_HANDLE_VALUE) {
		failure_start(file, line, "Can't access %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	ret = GetFileInformationByHandle(h, &st);
	if (ret == 0) {
		failure_start(file, line,
		    "Can't stat: %s", pathname);
		failure_finish(NULL);
	} else if ((st.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) == 0) {
		failure_start(file, line,
		    "Not a symlink: %s", pathname);
		failure_finish(NULL);
		ret = 0;
	}
	if (isdir && ((st.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) == 0)) {
		failure_start(file, line,
		    "Not a directory symlink: %s", pathname);
		failure_finish(NULL);
		ret = 0;
	}
	if (!isdir &&
	    ((st.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) != 0)) {
		failure_start(file, line,
		    "Not a file symlink: %s", pathname);
		failure_finish(NULL);
		ret = 0;
	}
	if (ret == 0) {
		CloseHandle(h);
		return (0);
	}

	indata = malloc(MAXIMUM_REPARSE_DATA_BUFFER_SIZE);
	ret = DeviceIoControl(h, FSCTL_GET_REPARSE_POINT, NULL, 0, indata,
	    1024, &inbytes, NULL);
	CloseHandle(h);
	if (ret == 0) {
		free(indata);
		failure_start(file, line,
		    "Could not retrieve symlink target: %s", pathname);
		failure_finish(NULL);
		return (0);
	}

	buf = (REPARSE_DATA_BUFFER *) indata;
	if (buf->ReparseTag != IO_REPARSE_TAG_SYMLINK) {
		free(indata);
		/* File is not a symbolic link */
		failure_start(file, line,
		    "Not a symlink: %s", pathname);
		failure_finish(NULL);
		return (0);
	}

	if (contents == NULL) {
		free(indata);
		return (1);
	}

	len = buf->SymbolicLinkReparseBuffer.SubstituteNameLength;

	linknamew = malloc(len + sizeof(wchar_t));
	if (linknamew == NULL) {
		free(indata);
		return (0);
	}

	memcpy(linknamew, &((BYTE *)buf->SymbolicLinkReparseBuffer.PathBuffer)
	    [buf->SymbolicLinkReparseBuffer.SubstituteNameOffset], len);
	free(indata);

	linknamew[len / sizeof(wchar_t)] = L'\0';

	contentsw = malloc(len + sizeof(wchar_t));
	if (contentsw == NULL) {
		free(linknamew);
		return (0);
	}

	len2 = mbsrtowcs(contentsw, &contents, (len + sizeof(wchar_t)
	    / sizeof(wchar_t)), NULL);

	if (len2 > 0 && wcscmp(linknamew, contentsw) != 0)
		ret = 1;

	free(linknamew);
	free(contentsw);
	return (ret);
#else
	char buff[300];
	struct stat st;
	ssize_t linklen;
	int r;

	(void)isdir; /* UNUSED */
	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0) {
		failure_start(file, line,
		    "Symlink should exist: %s", pathname);
		failure_finish(NULL);
		return (0);
	}
	if (!S_ISLNK(st.st_mode))
		return (0);
	if (contents == NULL)
		return (1);
	linklen = readlink(pathname, buff, sizeof(buff) - 1);
	if (linklen < 0) {
		failure_start(file, line, "Can't read symlink %s", pathname);
		failure_finish(NULL);
		return (0);
	}
	buff[linklen] = '\0';
	if (strcmp(buff, contents) != 0)
		return (0);
	return (1);
#endif
}